

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeEmpty(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp)

{
  SPxOut *pSVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  Verbosity VVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  int *piVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *args_4;
  ulong *puVar9;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int i;
  int remCols;
  int remRows;
  undefined4 in_stack_fffffffffffff2e8;
  int in_stack_fffffffffffff2ec;
  undefined4 in_stack_fffffffffffff2f0;
  int in_stack_fffffffffffff2f4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff2f8;
  undefined4 in_stack_fffffffffffff300;
  int in_stack_fffffffffffff304;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff328;
  undefined8 in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff33c;
  EmptyConstraintPS *in_stack_fffffffffffff340;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff370;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff378;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff380;
  bool local_c49;
  undefined4 local_c3c;
  Verbosity local_c38;
  undefined1 local_c31;
  undefined1 local_c20 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff3f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff3f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff400;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff408;
  undefined1 local_b78 [143];
  undefined1 in_stack_fffffffffffff517;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffff518;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff520;
  int in_stack_fffffffffffff52c;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff530;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff538;
  FixVariablePS *in_stack_fffffffffffff540;
  ulong local_a60;
  undefined1 local_a58 [128];
  ulong local_9d8;
  undefined1 local_9d0 [256];
  undefined8 local_8d0;
  undefined1 local_8c8 [128];
  undefined1 local_848 [128];
  undefined1 local_7c8 [256];
  undefined8 local_6c8;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffff940;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff948;
  int in_stack_fffffffffffff954;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff958;
  FixBoundsPS *in_stack_fffffffffffff960;
  undefined1 local_640 [128];
  undefined1 local_5c0 [128];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_540;
  int local_534;
  undefined1 local_52d;
  undefined8 local_480;
  undefined1 local_478 [128];
  undefined1 local_3f8 [256];
  undefined8 local_2f8;
  undefined1 local_2f0 [128];
  undefined1 local_270 [128];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 *local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined8 *local_158;
  undefined1 *local_150;
  undefined8 local_148;
  ulong *local_140;
  undefined1 *local_138;
  undefined8 local_130;
  ulong *local_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  ulong *local_50;
  ulong *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_1dc = 0;
  local_1e0 = 0;
  local_1d8 = in_RSI;
  local_1e4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x73c17a);
  while( true ) {
    do {
      local_1e4 = local_1e4 + -1;
      if (local_1e4 < 0) {
        local_534 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x73c5e8);
        do {
          do {
            local_534 = local_534 + -1;
            if (local_534 < 0) {
              if (0 < local_1dc + local_1e0) {
                (in_RDI->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_remRows = local_1dc +
                              (in_RDI->
                              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).m_remRows;
                (in_RDI->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_remCols = local_1e0 +
                              (in_RDI->
                              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).m_remCols;
                if (((in_RDI->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout != (SPxOut *)0x0) &&
                   (VVar5 = SPxOut::getVerbosity
                                      ((in_RDI->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout), 3 < (int)VVar5)) {
                  local_c38 = SPxOut::getVerbosity
                                        ((in_RDI->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout);
                  pSVar1 = (in_RDI->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout;
                  local_c3c = 4;
                  (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_c3c);
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                     (char *)CONCAT44(in_stack_fffffffffffff2ec,
                                                      in_stack_fffffffffffff2e8));
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                     in_stack_fffffffffffff2ec);
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                     (char *)CONCAT44(in_stack_fffffffffffff2ec,
                                                      in_stack_fffffffffffff2e8));
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                     in_stack_fffffffffffff2ec);
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                     (char *)CONCAT44(in_stack_fffffffffffff2ec,
                                                      in_stack_fffffffffffff2e8));
                  soplex::operator<<((SPxOut *)
                                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                     (_func_ostream_ptr_ostream_ptr *)
                                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
                  pSVar1 = (in_RDI->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout;
                  (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_c38);
                }
              }
              return OKAY;
            }
            local_540 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0)
                                    ,in_stack_fffffffffffff2ec);
            iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_540);
          } while (iVar4 != 0);
          pnVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                            in_stack_fffffffffffff2ec);
          pnVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                           in_stack_fffffffffffff2ec);
          args_4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                           in_stack_fffffffffffff2ec);
          SPxOut::
          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[54],_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                    (in_RDI,(char (*) [54])"IMAISM08 col {}: empty -> maxObj={} lower={} upper={}",
                     &local_534,pnVar6,pnVar7,args_4);
          local_100 = local_5c0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
          local_d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                              in_stack_fffffffffffff2ec);
          local_d0 = local_640;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          local_6c8 = 0;
          local_180 = &stack0xfffffffffffff940;
          local_188 = &local_6c8;
          local_190 = 0;
          local_30 = local_188;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                     (double)in_stack_fffffffffffff2f8,
                     (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
          epsZero(in_stack_fffffffffffff328);
          bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffff380,pnVar7,pnVar6);
          if (bVar2) {
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                    in_stack_fffffffffffff2ec);
            local_170 = infinity();
            local_168 = local_7c8;
            local_178 = 0;
            local_38 = local_170;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                       (double)in_stack_fffffffffffff2f8,
                       (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
            tVar3 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x73c832);
            if (tVar3) {
              SPxOut::
              debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[12],_0>
                        (in_RDI,(char (*) [12])0x7ebe7c);
              return UNBOUNDED;
            }
            local_68 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                               in_stack_fffffffffffff2ec);
            local_60 = local_5c0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          }
          else {
            local_c8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                in_stack_fffffffffffff2ec);
            local_c0 = local_848;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
            local_8d0 = 0;
            local_150 = local_8c8;
            local_158 = &local_8d0;
            local_160 = 0;
            local_40 = local_158;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                       (double)in_stack_fffffffffffff2f8,
                       (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
            epsZero(in_stack_fffffffffffff328);
            bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                               in_stack_fffffffffffff3f0);
            if (bVar2) {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                      in_stack_fffffffffffff2ec);
              puVar9 = (ulong *)infinity();
              local_9d8 = *puVar9 ^ 0x8000000000000000;
              local_138 = local_9d0;
              local_140 = &local_9d8;
              local_148 = 0;
              local_48 = local_140;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                         (double)in_stack_fffffffffffff2f8,
                         (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
              tVar3 = boost::multiprecision::operator<=
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x73ca30);
              if (tVar3) {
                SPxOut::
                debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[12],_0>
                          (in_RDI,(char (*) [12])0x7ebe7c);
                return UNBOUNDED;
              }
              local_78 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                 in_stack_fffffffffffff2ec);
              local_70 = local_5c0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                         (cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
            }
            else {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                      in_stack_fffffffffffff2ec);
              puVar9 = (ulong *)infinity();
              local_a60 = *puVar9 ^ 0x8000000000000000;
              local_120 = local_a58;
              local_128 = &local_a60;
              local_130 = 0;
              local_50 = local_128;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                         (double)in_stack_fffffffffffff2f8,
                         (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
              tVar3 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x73cb4d);
              if (tVar3) {
                local_88 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                                   in_stack_fffffffffffff2ec);
                local_80 = local_5c0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                          ((cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                           (cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
              }
              else {
                SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                        in_stack_fffffffffffff2ec);
                local_110 = infinity();
                local_108 = &stack0xfffffffffffff520;
                local_118 = 0;
                local_58 = local_110;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                           (double)in_stack_fffffffffffff2f8,
                           (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
                tVar3 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x73cc1a);
                if (tVar3) {
                  local_98 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0
                                                ),in_stack_fffffffffffff2ec);
                  local_90 = local_5c0;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                             (cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
                }
                else {
                  in_stack_fffffffffffff518 = (shared_ptr<soplex::Tolerances> *)0x0;
                  local_10 = local_5c0;
                  local_18 = &stack0xfffffffffffff518;
                  local_8 = local_18;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            (in_stack_fffffffffffff408,(double)in_stack_fffffffffffff400);
                }
              }
            }
          }
          SPxOut::
          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[10],_0>
                    (in_RDI,(char (*) [10])0x7eb329);
          in_stack_fffffffffffff328 =
               (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)operator_new(0x30);
          local_b0 = local_b78;
          local_b8 = local_5c0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          std::shared_ptr<soplex::Tolerances>::shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          FixBoundsPS::FixBoundsPS
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff954,
                     in_stack_fffffffffffff948,in_stack_fffffffffffff940);
          std::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
          ::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (FixBoundsPS *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x73cda9);
          operator_new(600);
          local_c31 = 1;
          local_a0 = local_c20;
          local_a8 = local_5c0;
          in_stack_fffffffffffff2f8 = local_1d8;
          in_stack_fffffffffffff304 = local_534;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          std::shared_ptr<soplex::Tolerances>::shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          in_stack_fffffffffffff2e8 = 1;
          FixVariablePS::FixVariablePS
                    (in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff530,
                     in_stack_fffffffffffff52c,in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                     (bool)in_stack_fffffffffffff517);
          local_c31 = 0;
          std::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
          ::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS,void>
                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     (FixVariablePS *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8))
          ;
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x73ce8e);
          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
          local_1e0 = local_1e0 + 1;
          removeCol((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                    in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f4);
          piVar8 = DataArray<int>::operator[](&in_RDI->m_stat,4);
          *piVar8 = *piVar8 + 1;
          std::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                         *)0x73cf25);
          std::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                         *)0x73cf32);
        } while( true );
      }
      local_1f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                              in_stack_fffffffffffff2ec);
      iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(local_1f0);
    } while (iVar4 != 0);
    SPxOut::
    debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[26],_int_&,_0>
              (in_RDI,(char (*) [26])"IMAISM07 row {}: empty ->",&local_1e4);
    local_f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                     in_stack_fffffffffffff2ec);
    local_f0 = local_270;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
    local_2f8 = 0;
    local_1b0 = local_2f0;
    local_1b8 = &local_2f8;
    local_1c0 = 0;
    local_20 = local_1b8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
               (double)in_stack_fffffffffffff2f8,
               (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
    feastol(in_stack_fffffffffffff328);
    bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0
                      );
    local_c49 = true;
    if (!bVar2) {
      local_e8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                       in_stack_fffffffffffff2ec);
      local_e0 = local_3f8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
      local_480 = 0;
      local_198 = local_478;
      local_1a0 = &local_480;
      local_1a8 = 0;
      local_28 = local_1a0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                 (double)in_stack_fffffffffffff2f8,
                 (type *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
      feastol(in_stack_fffffffffffff328);
      local_c49 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                             in_stack_fffffffffffff370);
    }
    if (local_c49 != false) break;
    SPxOut::
    debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[10],_0>
              (in_RDI,(char (*) [10])0x7eb329);
    in_stack_fffffffffffff380 =
         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)operator_new(0xb0);
    local_52d = 1;
    std::shared_ptr<soplex::Tolerances>::shared_ptr
              ((shared_ptr<soplex::Tolerances> *)
               CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
               (shared_ptr<soplex::Tolerances> *)
               CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
    EmptyConstraintPS::EmptyConstraintPS
              (in_stack_fffffffffffff340,
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),
               (int)((ulong)in_stack_fffffffffffff330 >> 0x20),
               (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff328);
    local_52d = 0;
    std::
    shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
    ::
    shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::EmptyConstraintPS,void>
              ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
               (EmptyConstraintPS *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x73c4e1);
    Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
    ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
              *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
             (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
              *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8));
    local_1dc = local_1dc + 1;
    removeRow((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
              in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f4);
    piVar8 = DataArray<int>::operator[](&in_RDI->m_stat,0);
    *piVar8 = *piVar8 + 1;
    std::
    shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
    ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                   *)0x73c557);
  }
  pnVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                 in_stack_fffffffffffff2ec);
  pnVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                 in_stack_fffffffffffff2ec);
  SPxOut::
  debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[27],_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
            (in_RDI,(char (*) [27])" infeasible lhs={} rhs={}\n",pnVar6,pnVar7);
  return INFEASIBLE;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}